

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::pi_pnm_observer::make_observation<double>
          (pi_pnm_observer *this,sparse_matrix<int> *param_1,double *param_2,double *pi)

{
  rgb rVar1;
  pnm_iterator_entry local_48;
  rgb local_3f;
  int local_3c;
  int i;
  colormap fct;
  iterator it;
  double *pi_local;
  double *param_2_local;
  sparse_matrix<int> *param_1_local;
  pi_pnm_observer *this_local;
  
  fct = (colormap)pnm_vector::begin(&this->m_pnm);
  colormap::colormap<float>((colormap *)&stack0xffffffffffffffc8,-1.0,1.0);
  for (local_3c = 0; local_3c != this->constraints; local_3c = local_3c + 1) {
    rVar1 = colormap::operator()((colormap *)&stack0xffffffffffffffc8,pi[local_3c]);
    local_3f._0_2_ = rVar1._0_2_;
    local_3f.blue = rVar1.blue;
    local_48 = pnm_iterator::operator*((pnm_iterator *)&fct);
    pnm_iterator_entry::operator=(&local_48,&local_3f);
  }
  pnm_vector::flush(&this->m_pnm);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& /*ap*/,
                          const Float* /*P*/,
                          const Float* pi)
    {
        static_assert(std::is_floating_point<Float>::value);

        auto it = m_pnm.begin();
        colormap fct(-1.f, +1.f);

        for (int i = 0; i != constraints; ++i)
            *it = fct(pi[i]);

        m_pnm.flush();
    }